

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O2

bool __thiscall
google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::AddSymbol
          (DescriptorIndex *this,StringPiece symbol)

{
  _Rb_tree_header *p_Var1;
  pointer pSVar2;
  StringPiece super_symbol;
  StringPiece sub_symbol;
  StringPiece super_symbol_00;
  undefined8 uVar3;
  _Alloc_hider _Var4;
  bool bVar5;
  const_iterator __pos;
  size_type sVar6;
  LogMessage *pLVar7;
  __normal_iterator<const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_*,_std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>_>
  _Var8;
  size_type sVar9;
  size_type extraout_RDX;
  __normal_iterator<const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_*,_std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>_>
  this_00;
  SymbolEntry *this_01;
  StringPiece sub_symbol_00;
  StringPiece sub_symbol_01;
  StringPiece sub_symbol_02;
  StringPiece super_symbol_01;
  StringPiece super_symbol_02;
  StringPiece name;
  LogFinisher local_e9;
  StringPiece local_e8;
  LogMessage local_d8;
  string local_a0;
  SymbolEntry *local_80;
  string entry_as_string;
  SymbolEntry entry;
  
  entry.data_offset =
       (int)(((long)(this->all_values_).
                    super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->all_values_).
                   super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x30) + -1;
  EncodeString_abi_cxx11_(&entry.encoded_symbol,this,symbol);
  SymbolEntry::AsString_abi_cxx11_(&entry_as_string,&entry,this);
  name.length_ = extraout_RDX;
  name.ptr_ = (char *)symbol.length_;
  bVar5 = anon_unknown_31::ValidateSymbolName((anon_unknown_31 *)symbol.ptr_,name);
  if (bVar5) {
    __pos = std::
            _Rb_tree<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::_Identity<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>
            ::upper_bound(&(this->by_symbol_)._M_t,&entry);
    if (__pos._M_node != (this->by_symbol_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left) {
      __pos._M_node = (_Base_ptr)std::_Rb_tree_decrement(__pos._M_node);
    }
    _Var4._M_p = entry_as_string._M_dataplus._M_p;
    local_e8.length_ =
         stringpiece_internal::StringPiece::CheckSize(entry_as_string._M_string_length);
    p_Var1 = &(this->by_symbol_)._M_t._M_impl.super__Rb_tree_header;
    local_e8.ptr_ = _Var4._M_p;
    if ((_Rb_tree_header *)__pos._M_node == p_Var1) {
LAB_003882eb:
      _Var8 = std::
              __upper_bound<__gnu_cxx::__normal_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_const*,std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>>>,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,__gnu_cxx::__ops::_Val_comp_iter<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare>>
                        ((this->by_symbol_flat_).
                         super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         (this->by_symbol_flat_).
                         super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>
                         ._M_impl.super__Vector_impl_data._M_finish,&entry,
                         (_Val_comp_iter<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare>
                          )(this->by_symbol_)._M_t._M_impl.
                           super__Rb_tree_key_compare<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare>
                           ._M_key_compare.index);
      this_00._M_current = _Var8._M_current + -1;
      if (_Var8._M_current ==
          (this->by_symbol_flat_).
          super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        this_00 = _Var8;
      }
      local_e8.length_ =
           stringpiece_internal::StringPiece::CheckSize(entry_as_string._M_string_length);
      pSVar2 = (this->by_symbol_flat_).
               super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_e8.ptr_ = entry_as_string._M_dataplus._M_p;
      if (this_00._M_current != pSVar2) {
        SymbolEntry::AsString_abi_cxx11_((string *)&local_d8,this_00._M_current,this);
        uVar3 = local_d8._0_8_;
        sVar6 = stringpiece_internal::StringPiece::CheckSize((size_type)local_d8.filename_);
        super_symbol_00.length_ = local_e8.length_;
        super_symbol_00.ptr_ = local_e8.ptr_;
        sub_symbol_01.length_ = sVar6;
        sub_symbol_01.ptr_ = (char *)uVar3;
        bVar5 = anon_unknown_31::IsSubSymbol(sub_symbol_01,super_symbol_00);
        std::__cxx11::string::~string((string *)&local_d8);
        sVar6 = local_e8.length_;
        if (bVar5) {
          internal::LogMessage::LogMessage
                    (&local_d8,LOGLEVEL_ERROR,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor_database.cc"
                     ,0x29c);
          pLVar7 = internal::LogMessage::operator<<(&local_d8,"Symbol name \"");
          pLVar7 = internal::LogMessage::operator<<(pLVar7,&local_e8);
          pLVar7 = internal::LogMessage::operator<<
                             (pLVar7,"\" conflicts with the existing symbol \"");
          SymbolEntry::AsString_abi_cxx11_(&local_a0,this_00._M_current,this);
          pLVar7 = internal::LogMessage::operator<<(pLVar7,&local_a0);
          pLVar7 = internal::LogMessage::operator<<(pLVar7,"\".");
          internal::LogFinisher::operator=(&local_e9,pLVar7);
          goto LAB_003884fb;
        }
        this_01 = this_00._M_current + 1;
        if (this_01 != pSVar2) {
          local_80 = (SymbolEntry *)local_e8.ptr_;
          SymbolEntry::AsString_abi_cxx11_((string *)&local_d8,this_01,this);
          sVar9 = stringpiece_internal::StringPiece::CheckSize((size_type)local_d8.filename_);
          sub_symbol_02.length_ = sVar6;
          sub_symbol_02.ptr_ = (char *)local_80;
          super_symbol_02.length_ = sVar9;
          super_symbol_02.ptr_ = (char *)local_d8._0_8_;
          bVar5 = anon_unknown_31::IsSubSymbol(sub_symbol_02,super_symbol_02);
          std::__cxx11::string::~string((string *)&local_d8);
          if (bVar5) {
            internal::LogMessage::LogMessage
                      (&local_d8,LOGLEVEL_ERROR,
                       "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor_database.cc"
                       ,0x2aa);
            pLVar7 = internal::LogMessage::operator<<(&local_d8,"Symbol name \"");
            pLVar7 = internal::LogMessage::operator<<(pLVar7,&local_e8);
            pLVar7 = internal::LogMessage::operator<<
                               (pLVar7,"\" conflicts with the existing symbol \"");
            SymbolEntry::AsString_abi_cxx11_(&local_a0,this_01,this);
            pLVar7 = internal::LogMessage::operator<<(pLVar7,&local_a0);
            pLVar7 = internal::LogMessage::operator<<(pLVar7,"\".");
            internal::LogFinisher::operator=(&local_e9,pLVar7);
            goto LAB_003884fb;
          }
        }
      }
      bVar5 = true;
      std::
      _Rb_tree<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,std::_Identity<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>>
      ::
      _M_insert_unique_<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_const&>
                ((_Rb_tree<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,std::_Identity<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>>
                  *)&this->by_symbol_,__pos,&entry);
      goto LAB_00388511;
    }
    SymbolEntry::AsString_abi_cxx11_((string *)&local_d8,(SymbolEntry *)(__pos._M_node + 1),this);
    uVar3 = local_d8._0_8_;
    sVar6 = stringpiece_internal::StringPiece::CheckSize((size_type)local_d8.filename_);
    super_symbol.length_ = local_e8.length_;
    super_symbol.ptr_ = local_e8.ptr_;
    sub_symbol_00.length_ = sVar6;
    sub_symbol_00.ptr_ = (char *)uVar3;
    bVar5 = anon_unknown_31::IsSubSymbol(sub_symbol_00,super_symbol);
    std::__cxx11::string::~string((string *)&local_d8);
    if (!bVar5) {
      __pos._M_node = (_Base_ptr)std::_Rb_tree_increment(__pos._M_node);
      if ((_Rb_tree_header *)__pos._M_node != p_Var1) {
        sub_symbol.length_ = local_e8.length_;
        sub_symbol.ptr_ = local_e8.ptr_;
        local_80 = (SymbolEntry *)(__pos._M_node + 1);
        SymbolEntry::AsString_abi_cxx11_((string *)&local_d8,local_80,this);
        uVar3 = local_d8._0_8_;
        sVar6 = stringpiece_internal::StringPiece::CheckSize((size_type)local_d8.filename_);
        super_symbol_01.length_ = sVar6;
        super_symbol_01.ptr_ = (char *)uVar3;
        bVar5 = anon_unknown_31::IsSubSymbol(sub_symbol,super_symbol_01);
        std::__cxx11::string::~string((string *)&local_d8);
        if (bVar5) {
          internal::LogMessage::LogMessage
                    (&local_d8,LOGLEVEL_ERROR,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor_database.cc"
                     ,0x2aa);
          pLVar7 = internal::LogMessage::operator<<(&local_d8,"Symbol name \"");
          pLVar7 = internal::LogMessage::operator<<(pLVar7,&local_e8);
          pLVar7 = internal::LogMessage::operator<<
                             (pLVar7,"\" conflicts with the existing symbol \"");
          SymbolEntry::AsString_abi_cxx11_(&local_a0,local_80,this);
          pLVar7 = internal::LogMessage::operator<<(pLVar7,&local_a0);
          pLVar7 = internal::LogMessage::operator<<(pLVar7,"\".");
          internal::LogFinisher::operator=(&local_e9,pLVar7);
          goto LAB_003884fb;
        }
      }
      goto LAB_003882eb;
    }
    internal::LogMessage::LogMessage
              (&local_d8,LOGLEVEL_ERROR,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor_database.cc"
               ,0x29c);
    pLVar7 = internal::LogMessage::operator<<(&local_d8,"Symbol name \"");
    pLVar7 = internal::LogMessage::operator<<(pLVar7,&local_e8);
    pLVar7 = internal::LogMessage::operator<<(pLVar7,"\" conflicts with the existing symbol \"");
    SymbolEntry::AsString_abi_cxx11_(&local_a0,(SymbolEntry *)(__pos._M_node + 1),this);
    pLVar7 = internal::LogMessage::operator<<(pLVar7,&local_a0);
    pLVar7 = internal::LogMessage::operator<<(pLVar7,"\".");
    internal::LogFinisher::operator=(&local_e9,pLVar7);
LAB_003884fb:
    std::__cxx11::string::~string((string *)&local_a0);
  }
  else {
    internal::LogMessage::LogMessage
              (&local_d8,LOGLEVEL_ERROR,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor_database.cc"
               ,0x2bf);
    pLVar7 = internal::LogMessage::operator<<(&local_d8,"Invalid symbol name: ");
    pLVar7 = internal::LogMessage::operator<<(pLVar7,&entry_as_string);
    internal::LogFinisher::operator=((LogFinisher *)&local_a0,pLVar7);
  }
  internal::LogMessage::~LogMessage(&local_d8);
  bVar5 = false;
LAB_00388511:
  std::__cxx11::string::~string((string *)&entry_as_string);
  std::__cxx11::string::~string((string *)&entry.encoded_symbol);
  return bVar5;
}

Assistant:

bool EncodedDescriptorDatabase::DescriptorIndex::AddSymbol(
    StringPiece symbol) {
  SymbolEntry entry = {static_cast<int>(all_values_.size() - 1),
                       EncodeString(symbol)};
  std::string entry_as_string = entry.AsString(*this);

  // We need to make sure not to violate our map invariant.

  // If the symbol name is invalid it could break our lookup algorithm (which
  // relies on the fact that '.' sorts before all other characters that are
  // valid in symbol names).
  if (!ValidateSymbolName(symbol)) {
    GOOGLE_LOG(ERROR) << "Invalid symbol name: " << entry_as_string;
    return false;
  }

  auto iter = FindLastLessOrEqual(&by_symbol_, entry);
  if (!CheckForMutualSubsymbols(entry_as_string, &iter, by_symbol_.end(),
                                *this)) {
    return false;
  }

  // Same, but on by_symbol_flat_
  auto flat_iter =
      FindLastLessOrEqual(&by_symbol_flat_, entry, by_symbol_.key_comp());
  if (!CheckForMutualSubsymbols(entry_as_string, &flat_iter,
                                by_symbol_flat_.end(), *this)) {
    return false;
  }

  // OK, no conflicts.

  // Insert the new symbol using the iterator as a hint, the new entry will
  // appear immediately before the one the iterator is pointing at.
  by_symbol_.insert(iter, entry);

  return true;
}